

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O2

void __thiscall
Qentem::BigInt<unsigned_long_long,_1024U>::Add
          (BigInt<unsigned_long_long,_1024U> *this,unsigned_long_long number,SizeT32 index)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (number != 0) {
    uVar2 = (ulong)index;
    uVar3 = index - 1;
    do {
      if (0xf < uVar2) {
        this->index_ = 0;
        return;
      }
      uVar1 = this->storage_[uVar2];
      uVar3 = uVar3 + 1;
      uVar4 = number + uVar1;
      this->storage_[uVar2] = uVar4;
      uVar2 = uVar2 + 1;
      number = 1;
    } while (uVar4 <= uVar1);
    if (this->index_ < uVar3) {
      this->index_ = uVar3;
    }
  }
  return;
}

Assistant:

void Add(Number_T number, SizeT32 index = 0U) noexcept {
        if (number != 0) {
            while (index <= MaxIndex()) {
                const Number_T tmp = storage_[index];
                storage_[index] += number;

                if (storage_[index] > tmp) {
                    break;
                }

                // Overflow.
                number = Number_T{1};
                ++index;
            }

            if (index > MaxIndex()) {
                index_ = 0;
            } else if (index > index_) {
                index_ = index;
            }
        }
    }